

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O0

void dirSAVECDTCode(path *cdtname)

{
  bool bVar1;
  bool local_5c [4];
  int iStack_58;
  bool opt [3];
  aint args [3];
  undefined1 local_38 [8];
  string tfname;
  char *argerr;
  path *cdtname_local;
  
  tfname.field_2._8_8_ = anon_var_dwarf_1a84b;
  bVar1 = anyComma(&lp);
  if (bVar1) {
    GetDelimitedString_abi_cxx11_((string *)local_38,&lp);
    bVar1 = anyComma(&lp);
    if (bVar1) {
      iStack_58 = 0;
      _opt = 0;
      local_5c[2] = true;
      local_5c[0] = false;
      local_5c[1] = false;
      bVar1 = getIntArguments<3>(&lp,(aint (*) [3])&iStack_58,(bool (*) [3])local_5c);
      if ((((bVar1) && (-1 < iStack_58)) && (0 < _opt)) &&
         ((_opt < 0x10000 && (iStack_58 + _opt < 0x10001)))) {
        SaveCDT_Code(cdtname,(string *)local_38,iStack_58,_opt,-1);
      }
      else {
        Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
              ,lp,SUPPRESS);
      }
    }
    else {
      Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
            ,lp,SUPPRESS);
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
          ,lp,SUPPRESS);
  }
  return;
}

Assistant:

static void dirSAVECDTCode(const std::filesystem::path & cdtname) {
	constexpr const char* argerr = "[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]";

	if (!anyComma(lp)) {
		Error(argerr, lp, SUPPRESS); return;
	}

	const std::string tfname = GetDelimitedString(lp);
	if (!anyComma(lp)) {
		Error(argerr, lp, SUPPRESS); return;
	}

	aint args[] = { /*0:start*/ 0, /*1:length*/ 0, /*2:customStart*/ -1 };
	bool opt[] = { false, false, true };
	if (!getIntArguments<3>(lp, args, opt) || args[0] < 0 || args[1] < 1 || 0x10000 <= args[1] || 0x10000 < (args[0]+args[1])) {
		Error(argerr, lp, SUPPRESS); return;
	}

	SaveCDT_Code(cdtname, tfname, args[0], args[1], args[2]);
}